

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_59::InMemoryDirectory::InMemoryDirectory
          (InMemoryDirectory *this,Clock *clock,InMemoryFileFactory *fileFactory)

{
  InMemoryFileFactory *fileFactory_local;
  Clock *clock_local;
  InMemoryDirectory *this_local;
  
  Directory::Directory(&this->super_Directory);
  AtomicRefcounted::AtomicRefcounted(&this->super_AtomicRefcounted);
  (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
       (_func_int **)&PTR_getFd_004c7da0;
  (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)&DAT_004c7e78;
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::
  MutexGuarded<kj::Clock_const&,kj::InMemoryFileFactory_const&>(&this->impl,clock,fileFactory);
  return;
}

Assistant:

InMemoryDirectory(const Clock& clock, const InMemoryFileFactory& fileFactory)
      : impl(clock, fileFactory) {}